

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O3

bool __thiscall CoreML::NeuralNetworkShaper::isValid(NeuralNetworkShaper *this)

{
  bool bVar1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  _Self __tmp;
  
  p_Var2 = (this->blobShapes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(this->blobShapes)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 == p_Var3) {
    bVar1 = true;
  }
  else {
    do {
      bVar1 = ShapeConstraint::isValid((ShapeConstraint *)(p_Var2 + 2));
      if (!bVar1) {
        return bVar1;
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
  }
  return bVar1;
}

Assistant:

bool NeuralNetworkShaper::isValid() const {
    // TODO: make this check all of the blob names, and make it compare to the input and output shapes
    for (auto ind = blobShapes.begin(); ind != blobShapes.end(); ind++) {
        if (!(*ind).second.isValid())
            return false;
    }
    return true;
}